

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::GeneratedExtensionFinder::Find
          (GeneratedExtensionFinder *this,int number,ExtensionInfo *output)

{
  EnumValidityFuncWithArg *pEVar1;
  FieldDescriptor *pFVar2;
  FieldType FVar3;
  bool bVar4;
  bool bVar5;
  undefined5 uVar6;
  second_type *psVar7;
  first_type local_18;
  
  if ((anonymous_namespace)::registry_ ==
      (hash_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::hash<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
       *)0x0) {
    return false;
  }
  local_18.first = this->containing_type_;
  local_18.second = number;
  psVar7 = FindOrNull<google::protobuf::hash_map<std::pair<google::protobuf::MessageLite_const*,int>,google::protobuf::internal::ExtensionInfo,google::protobuf::hash<std::pair<google::protobuf::MessageLite_const*,int>>,std::equal_to<std::pair<google::protobuf::MessageLite_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::MessageLite_const*,int>const,google::protobuf::internal::ExtensionInfo>>>>
                     ((anonymous_namespace)::registry_,&local_18);
  if (psVar7 != (second_type *)0x0) {
    FVar3 = psVar7->type;
    bVar4 = psVar7->is_repeated;
    bVar5 = psVar7->is_packed;
    uVar6 = *(undefined5 *)&psVar7->field_0x3;
    pEVar1 = (psVar7->field_3).enum_validity_check.func;
    pFVar2 = psVar7->descriptor;
    (output->field_3).enum_validity_check.arg = (psVar7->field_3).enum_validity_check.arg;
    output->descriptor = pFVar2;
    output->type = FVar3;
    output->is_repeated = bVar4;
    output->is_packed = bVar5;
    *(undefined5 *)&output->field_0x3 = uVar6;
    (output->field_3).enum_validity_check.func = pEVar1;
  }
  return psVar7 != (second_type *)0x0;
}

Assistant:

bool GeneratedExtensionFinder::Find(int number, ExtensionInfo* output) {
  const ExtensionInfo* extension =
      FindRegisteredExtension(containing_type_, number);
  if (extension == NULL) {
    return false;
  } else {
    *output = *extension;
    return true;
  }
}